

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O1

int Cbs_ManResolve(Cbs_Man_t *p,int Level,int hClause0,int hClause1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t **ppGVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Gia_Obj_t *pGVar9;
  
  ppGVar5 = (p->pClauses).pData;
  pGVar9 = ppGVar5[Level];
  if (pGVar9 == (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[hClause0] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x2b9,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
  }
  if (pGVar9 != ppGVar5[hClause0]) {
    __assert_fail("pQue->pData[hClause0] == pQue->pData[hClause1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x2ba,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
  }
  iVar7 = (p->pClauses).iTail;
  if ((p->pClauses).iHead != iVar7) {
    __assert_fail("Cbs_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x2c1,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
  }
  iVar1 = (p->pClauses).nSize;
  if (iVar7 == iVar1) {
    (p->pClauses).nSize = iVar1 * 2;
    ppGVar5 = (p->pClauses).pData;
    if (ppGVar5 == (Gia_Obj_t **)0x0) {
      ppGVar5 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
    }
    else {
      ppGVar5 = (Gia_Obj_t **)realloc(ppGVar5,(long)iVar1 << 4);
    }
    (p->pClauses).pData = ppGVar5;
  }
  iVar7 = (p->pClauses).iTail;
  (p->pClauses).iTail = iVar7 + 1;
  (p->pClauses).pData[iVar7] = (Gia_Obj_t *)0x0;
  pGVar9 = (p->pClauses).pData[(long)Level + 1];
  if (pGVar9 == (Gia_Obj_t *)0x0) {
    iVar7 = -1;
  }
  else {
    lVar8 = (long)(Level + 1) * 8;
    iVar7 = -1;
    do {
      lVar8 = lVar8 + 8;
      if (((uint)*(ulong *)pGVar9 >> 0x1e & 1) != 0) {
        *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xffffffffbfffffff;
        if (((ulong)pGVar9 & 1) != 0) goto LAB_007135b8;
        iVar1 = (p->pClauses).nSize;
        if ((p->pClauses).iTail == iVar1) {
          (p->pClauses).nSize = iVar1 * 2;
          ppGVar5 = (p->pClauses).pData;
          if (ppGVar5 == (Gia_Obj_t **)0x0) {
            ppGVar5 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
          }
          else {
            ppGVar5 = (Gia_Obj_t **)realloc(ppGVar5,(long)iVar1 << 4);
          }
          (p->pClauses).pData = ppGVar5;
        }
        iVar1 = (p->pClauses).iTail;
        (p->pClauses).iTail = iVar1 + 1;
        (p->pClauses).pData[iVar1] = pGVar9;
        uVar2 = pGVar9->Value;
        if (uVar2 == 0xffffffff) goto LAB_00713599;
        uVar4 = uVar2 * 3;
        if ((int)uVar4 < 0) goto LAB_0071357a;
        uVar3 = p->vLevReas->nSize;
        if (uVar3 == uVar4 || SBORROW4(uVar3,uVar4) != (int)(uVar3 + uVar2 * -3) < 0)
        goto LAB_0071357a;
        iVar1 = p->vLevReas->pArray[uVar4];
        if (iVar7 <= iVar1) {
          iVar7 = iVar1;
        }
      }
      pGVar9 = *(Gia_Obj_t **)((long)(p->pClauses).pData + lVar8);
    } while (pGVar9 != (Gia_Obj_t *)0x0);
  }
  pGVar9 = (p->pClauses).pData[(long)hClause0 + 1];
  if (pGVar9 != (Gia_Obj_t *)0x0) {
    lVar8 = (long)(hClause0 + 1) * 8;
    do {
      lVar8 = lVar8 + 8;
      if (((uint)*(ulong *)pGVar9 >> 0x1e & 1) != 0) {
        *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xffffffffbfffffff;
        if (((ulong)pGVar9 & 1) != 0) {
LAB_007135b8:
          __assert_fail("!Gia_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,0x120,"void Cbs_QuePush(Cbs_Que_t *, Gia_Obj_t *)");
        }
        iVar1 = (p->pClauses).nSize;
        if ((p->pClauses).iTail == iVar1) {
          (p->pClauses).nSize = iVar1 * 2;
          ppGVar5 = (p->pClauses).pData;
          if (ppGVar5 == (Gia_Obj_t **)0x0) {
            ppGVar5 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
          }
          else {
            ppGVar5 = (Gia_Obj_t **)realloc(ppGVar5,(long)iVar1 << 4);
          }
          (p->pClauses).pData = ppGVar5;
        }
        iVar1 = (p->pClauses).iTail;
        (p->pClauses).iTail = iVar1 + 1;
        (p->pClauses).pData[iVar1] = pGVar9;
        uVar2 = pGVar9->Value;
        if (uVar2 == 0xffffffff) {
LAB_00713599:
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,99,"int Cbs_VarDecLevel(Cbs_Man_t *, Gia_Obj_t *)");
        }
        uVar4 = uVar2 * 3;
        if ((int)uVar4 < 0) {
LAB_0071357a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar3 = p->vLevReas->nSize;
        if (uVar3 == uVar4 || SBORROW4(uVar3,uVar4) != (int)(uVar3 + uVar2 * -3) < 0)
        goto LAB_0071357a;
        iVar1 = p->vLevReas->pArray[uVar4];
        if (iVar7 <= iVar1) {
          iVar7 = iVar1;
        }
      }
      pGVar9 = *(Gia_Obj_t **)((long)(p->pClauses).pData + lVar8);
    } while (pGVar9 != (Gia_Obj_t *)0x0);
  }
  iVar1 = (p->pClauses).iHead;
  if (iVar1 + 1 < (p->pClauses).iTail) {
    lVar8 = (long)iVar1 + 1;
    do {
      pGVar9 = (p->pClauses).pData[lVar8];
      *(ulong *)pGVar9 = *(ulong *)pGVar9 | 0x40000000;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->pClauses).iTail);
  }
  Cbs_ManDeriveReason(p,iVar7);
  iVar7 = (p->pClauses).iHead;
  iVar1 = (p->pClauses).iTail;
  if (iVar1 <= iVar7) {
    __assert_fail("p->iHead < p->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x172,"int Cbs_QueFinish(Cbs_Que_t *)");
  }
  iVar6 = (p->pClauses).nSize;
  if (iVar1 == iVar6) {
    (p->pClauses).nSize = iVar6 * 2;
    ppGVar5 = (p->pClauses).pData;
    if (ppGVar5 == (Gia_Obj_t **)0x0) {
      ppGVar5 = (Gia_Obj_t **)malloc((long)iVar6 << 4);
    }
    else {
      ppGVar5 = (Gia_Obj_t **)realloc(ppGVar5,(long)iVar6 << 4);
    }
    (p->pClauses).pData = ppGVar5;
  }
  iVar1 = (p->pClauses).iTail;
  iVar6 = iVar1 + 1;
  (p->pClauses).iTail = iVar6;
  (p->pClauses).pData[iVar1] = (Gia_Obj_t *)0x0;
  (p->pClauses).iHead = iVar6;
  return iVar7;
}

Assistant:

static inline int Cbs_ManResolve( Cbs_Man_t * p, int Level, int hClause0, int hClause1 )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj;
    int i, LevelMax = -1, LevelCur;
    assert( pQue->pData[hClause0] != NULL );
    assert( pQue->pData[hClause0] == pQue->pData[hClause1] );
/*
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fMark0 == 1 );
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fMark0 == 1 );
*/
    assert( Cbs_QueIsEmpty( pQue ) );
    Cbs_QuePush( pQue, NULL );
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Cbs_QuePush( pQue, pObj );
        LevelCur = Cbs_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Cbs_QuePush( pQue, pObj );
        LevelCur = Cbs_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
        pQue->pData[i]->fMark0 = 1;
    Cbs_ManDeriveReason( p, LevelMax );
    return Cbs_QueFinish( pQue );
}